

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O1

int aq_add_frame(aq_t *q,mp3_frame_t *frame)

{
  void *pvVar1;
  ulong uVar2;
  dlist_t *dlist;
  bool bVar3;
  unsigned_long uVar4;
  void *__ptr;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  dlist_s *pdVar9;
  int iVar10;
  uchar *__dest;
  uint uVar11;
  adu_t local_5e90;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x133,"int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x134,
                  "int aq_add_frame(aq_t *, mp3_frame_t *)");
  }
  uVar11 = (frame->si).main_data_end;
  if (frame->frame_data_size + (long)(int)uVar11 < frame->adu_size) {
    aq_add_frame_cold_1();
    iVar7 = 0;
  }
  else {
    uVar4 = q->size;
    aq_enqueue_frame(q,frame);
    iVar7 = 0;
    if (((int)uVar11 <= (int)uVar4) && (iVar7 = 0, frame->adu_size <= q->size)) {
      pdVar9 = (q->frames).end;
      if (pdVar9 == (dlist_t *)0x0) {
        __assert_fail("dlist != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xf5,
                      "void aq_make_adu(aq_t *)");
      }
      pvVar1 = pdVar9->data;
      if (pvVar1 == (void *)0x0) {
        __assert_fail("tail != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xf7,
                      "void aq_make_adu(aq_t *)");
      }
      uVar11 = *(uint *)((long)pvVar1 + 0x10);
      memcpy(&local_5e90,pvVar1,0x5e60);
      do {
        iVar7 = 0;
        if (uVar11 == 0) break;
        pdVar9 = pdVar9->prev;
        if (pdVar9 == (dlist_s *)0x0) {
          __assert_fail("dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x102,
                        "void aq_make_adu(aq_t *)");
        }
        if (pdVar9->data == (void *)0x0) {
          __assert_fail("prev_frame != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x104,
                        "void aq_make_adu(aq_t *)");
        }
        uVar2 = *(ulong *)((long)pdVar9->data + 0x4eb0);
        uVar6 = (ulong)uVar11;
        iVar7 = (int)uVar2 - uVar11;
        iVar8 = 0;
        if (uVar2 < uVar6) {
          iVar8 = (int)uVar2;
        }
        uVar11 = uVar11 - iVar8;
      } while (uVar2 < uVar6);
      while (dlist = (q->frames).dlist, dlist != pdVar9) {
        if (dlist == (dlist_t *)0x0) {
          __assert_fail("q->frames.dlist != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x9f,
                        "void aq_discard_top_frame(aq_t *)");
        }
        __ptr = dlist_get(&q->frames,dlist);
        if (__ptr == (void *)0x0) {
          __assert_fail("frame != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0xa1,
                        "void aq_discard_top_frame(aq_t *)");
        }
        q->size = q->size - *(long *)((long)__ptr + 0x4eb0);
        free(__ptr);
      }
      if (0 < *(int *)((long)pvVar1 + 0x4e80)) {
        lVar5 = (long)iVar7;
        __dest = local_5e90.raw + local_5e90.si_size + (ulong)(local_5e90.protected == '\0') * 2 + 4
        ;
        iVar7 = *(int *)((long)pvVar1 + 0x4e80);
        do {
          if (pdVar9 == (dlist_t *)0x0) {
            __assert_fail("dlist != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x116
                          ,"void aq_make_adu(aq_t *)");
          }
          pvVar1 = pdVar9->data;
          if (pvVar1 == (void *)0x0) {
            __assert_fail("f != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x118
                          ,"void aq_make_adu(aq_t *)");
          }
          iVar8 = *(int *)((long)pvVar1 + 0x4eb0) - (int)lVar5;
          if (iVar7 < iVar8) {
            iVar8 = iVar7;
          }
          memcpy(__dest,(void *)((long)pvVar1 +
                                lVar5 + *(long *)((long)pvVar1 + 0x4e68) +
                                        (ulong)(*(char *)((long)pvVar1 + 2) == '\0') * 2 + 0x4ec4),
                 (long)iVar8);
          __dest = __dest + iVar8;
          pdVar9 = pdVar9->next;
          lVar5 = 0;
          iVar10 = iVar7 - iVar8;
          bVar3 = iVar8 <= iVar7;
          iVar7 = iVar10;
        } while (iVar10 != 0 && bVar3);
      }
      aq_enqueue_adu(q,&local_5e90);
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int aq_add_frame(aq_t *q, mp3_frame_t *frame) {
  assert(q != NULL);
  assert(frame != NULL);

  int back_ptr    = frame->si.main_data_end;
  int size_before = q->size;

  /* discard broken frames */
  if (frame->adu_size > (frame->frame_data_size + back_ptr)) {
    fprintf(stderr, "Broken frame, skipping...\n");
    return 0;
  }

  assert(frame->adu_size <= (frame->frame_data_size + back_ptr));
  
  aq_enqueue_frame(q, frame);

  if ((size_before < back_ptr) ||
      (q->size < frame->adu_size))
    return 0;

  aq_make_adu(q);
  return 1;
}